

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O1

void RunConstantPropagation(ExpressionContext *ctx,VmModule *module,VmValue *value,bool nested)

{
  VmValueType VVar1;
  int iVar2;
  VariableData *pVVar3;
  long lVar4;
  double value_00;
  VmValue *pVVar5;
  VmValue *pVVar6;
  VmConstant *pVVar7;
  ulong uVar8;
  char *__function;
  int iVar9;
  uint uVar10;
  long lVar11;
  VmConstant *pVVar12;
  ulong uVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  SmallArray<VmConstant_*,_32U> consts;
  SmallArray<VmConstant_*,_32U> local_148;
  
  if ((value == (VmValue *)0x0) || (pVVar5 = value, value->typeID != 4)) {
    pVVar5 = (VmValue *)0x0;
  }
  if (pVVar5 != (VmValue *)0x0) {
    pVVar5 = (VmValue *)pVVar5[1].source;
    while (pVVar5 != (VmValue *)0x0) {
      pVVar6 = (VmValue *)pVVar5[1].comment.begin;
      RunConstantPropagation(ctx,module,pVVar5,nested);
      pVVar5 = pVVar6;
    }
    return;
  }
  if ((value == (VmValue *)0x0) || (pVVar5 = value, value->typeID != 3)) {
    pVVar5 = (VmValue *)0x0;
  }
  if (pVVar5 != (VmValue *)0x0) {
    pVVar5 = (VmValue *)pVVar5[1].comment.end;
    while (pVVar5 != (VmValue *)0x0) {
      pVVar6 = pVVar5[1].users.little[0];
      RunConstantPropagation(ctx,module,pVVar5,nested);
      pVVar5 = pVVar6;
    }
    return;
  }
  if ((value == (VmValue *)0x0) || (value->typeID != 2)) {
    value = (VmValue *)0x0;
  }
  if (value == (VmValue *)0x0) {
    return;
  }
  VVar1 = (value->type).type;
  uVar10 = (value->type).size;
  if (uVar10 != 4 || VVar1 != VM_TYPE_INT) {
    if ((VVar1 != VM_TYPE_POINTER) && ((VVar1 & ~VM_TYPE_INT) != VM_TYPE_DOUBLE || uVar10 != 8)) {
      return;
    }
  }
  local_148.allocator = module->allocator;
  local_148.data = local_148.little;
  local_148.count = 0;
  local_148.max = 0x20;
  if (value[1].type.type != VM_TYPE_VOID) {
    uVar13 = 0;
    do {
      pVVar7 = *(VmConstant **)(*(long *)&value[1].typeID + uVar13 * 8);
      if ((pVVar7 == (VmConstant *)0x0) || (pVVar12 = pVVar7, (pVVar7->super_VmValue).typeID != 1))
      {
        pVVar12 = (VmConstant *)0x0;
      }
      if (pVVar12 == (VmConstant *)0x0) {
        if (nested) {
          RunConstantPropagation(ctx,module,&pVVar7->super_VmValue,true);
          if (value[1].type.type <= uVar13) {
            __function = 
            "T &SmallArray<VmValue *, 4>::operator[](unsigned int) [T = VmValue *, N = 4]";
            goto LAB_001b0dbc;
          }
          pVVar12 = *(VmConstant **)(*(long *)&value[1].typeID + uVar13 * 8);
          if ((pVVar12 == (VmConstant *)0x0) || ((pVVar12->super_VmValue).typeID != 1)) {
            pVVar12 = (VmConstant *)0x0;
          }
        }
        if (pVVar12 == (VmConstant *)0x0) goto switchD_001afdc1_caseD_8;
      }
      if (local_148.count == local_148.max) {
        SmallArray<VmConstant_*,_32U>::grow(&local_148,local_148.count);
      }
      if (local_148.data == (VmConstant **)0x0) {
        __assert_fail("data",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                      ,0x162,
                      "void SmallArray<VmConstant *, 32>::push_back(const T &) [T = VmConstant *, N = 32]"
                     );
      }
      uVar8 = local_148._8_8_ & 0xffffffff;
      local_148.count = local_148.count + 1;
      local_148.data[uVar8] = pVVar12;
      uVar13 = uVar13 + 1;
    } while (uVar13 < value[1].type.type);
  }
  switch(*(undefined4 *)&value[1]._vptr_VmValue) {
  case 7:
    VVar1 = (value->type).type;
    uVar10 = (value->type).size;
    if (uVar10 == 4 && VVar1 == VM_TYPE_INT) {
      if (local_148.count == 0) goto LAB_001b0da7;
      uVar10 = (*local_148.data)->iValue;
      goto LAB_001b0b4c;
    }
    uVar10 = uVar10 ^ 8;
    if (VVar1 == VM_TYPE_DOUBLE && uVar10 == 0) {
      if (local_148.count == 0) goto LAB_001b0da7;
      value_00 = (*local_148.data)->dValue;
      goto LAB_001b0ca0;
    }
    if (VVar1 != VM_TYPE_LONG || uVar10 != 0) goto switchD_001afdc1_caseD_8;
    if (local_148.count == 0) goto LAB_001b0da7;
    uVar13 = (*local_148.data)->lValue;
    break;
  default:
    goto switchD_001afdc1_caseD_8;
  case 0xf:
    if (local_148.count == 0) goto LAB_001b0da7;
    uVar10 = (uint)(*local_148.data)->dValue;
    goto LAB_001b0b4c;
  case 0x10:
    if (local_148.count == 0) goto LAB_001b0da7;
    uVar13 = (ulong)(*local_148.data)->dValue;
    break;
  case 0x11:
    if (local_148.count == 0) goto LAB_001b0da7;
    pVVar7 = CreateConstantInt(module->allocator,value->source,(int)(float)(*local_148.data)->dValue
                              );
    pVVar7->isFloat = true;
    if ((value->users).count != 0) {
      uVar13 = 0;
      do {
        pVVar5 = (value->users).data[uVar13];
        if ((pVVar5 == (VmValue *)0x0) || (pVVar6 = pVVar5, pVVar5->typeID != 2)) {
          pVVar6 = (VmValue *)0x0;
        }
        if ((pVVar6 != (VmValue *)0x0) && (*(int *)&pVVar6[1]._vptr_VmValue == 0x1f)) {
          anon_unknown.dwarf_13465d::ReplaceValue(module,pVVar5,value,&pVVar7->super_VmValue);
          module->constantPropagations = module->constantPropagations + 1;
        }
        uVar13 = uVar13 + 1;
      } while (uVar13 < (value->users).count);
    }
    (module->tempUsers).count = 0;
    goto switchD_001afdc1_caseD_8;
  case 0x12:
    if (local_148.count == 0) goto LAB_001b0da7;
    value_00 = (double)(*local_148.data)->iValue;
    goto LAB_001b0ca0;
  case 0x13:
    if (local_148.count == 0) goto LAB_001b0da7;
    value_00 = (double)(*local_148.data)->lValue;
    goto LAB_001b0ca0;
  case 0x14:
    if (local_148.count == 0) goto LAB_001b0da7;
    uVar13 = (ulong)(*local_148.data)->iValue;
    break;
  case 0x15:
    if (local_148.count == 0) goto LAB_001b0da7;
    uVar10 = (uint)(*local_148.data)->lValue;
    goto LAB_001b0b4c;
  case 0x16:
    if ((((local_148.count == 0) || (local_148.count == 1)) || (local_148.count < 3)) ||
       (local_148.count == 3)) goto LAB_001b0da7;
    if ((uint)local_148.data[3]->iValue < (uint)(*local_148.data)->iValue) {
      pVVar7 = CreateConstantPointer
                         (module->allocator,value->source,
                          local_148.data[3]->iValue * local_148.data[1]->iValue +
                          local_148.data[2]->iValue,local_148.data[2]->container,
                          (value->type).structType,true);
      anon_unknown.dwarf_13465d::ReplaceValueUsersWith
                (module,value,&pVVar7->super_VmValue,&module->constantPropagations);
    }
    goto switchD_001afdc1_caseD_8;
  case 0x22:
    VVar1 = (value->type).type;
    if (VVar1 != VM_TYPE_POINTER) {
      uVar10 = (value->type).size;
      if (uVar10 == 4 && VVar1 == VM_TYPE_INT) {
        if ((local_148.count == 1) || (local_148.count == 0)) goto LAB_001b0da7;
        uVar10 = local_148.data[1]->iValue + (*local_148.data)->iValue;
        goto LAB_001b0b4c;
      }
      uVar10 = uVar10 ^ 8;
      if (VVar1 == VM_TYPE_DOUBLE && uVar10 == 0) {
        if ((local_148.count == 1) || (local_148.count == 0)) goto LAB_001b0da7;
        value_00 = (*local_148.data)->dValue + local_148.data[1]->dValue;
        goto LAB_001b0ca0;
      }
      if (VVar1 != VM_TYPE_LONG || uVar10 != 0) goto switchD_001afdc1_caseD_8;
      if ((local_148.count == 1) || (local_148.count == 0)) goto LAB_001b0da7;
      uVar13 = local_148.data[1]->lValue + (*local_148.data)->lValue;
      break;
    }
    if (local_148.count == 0) {
LAB_001b0da7:
      __function = 
      "T &SmallArray<VmConstant *, 32>::operator[](unsigned int) [T = VmConstant *, N = 32]";
LAB_001b0dbc:
      __assert_fail("index < count",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                    ,0x199,__function);
    }
    pVVar3 = (*local_148.data)->container;
    if (pVVar3 != (VariableData *)0x0) {
      if (local_148.count == 1) goto LAB_001b0da7;
      if (local_148.data[1]->container != (VariableData *)0x0) {
        __assert_fail("!(consts[0]->container && consts[1]->container)",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                      ,0x123e,
                      "void RunConstantPropagation(ExpressionContext &, VmModule *, VmValue *, bool)"
                     );
      }
    }
    if (local_148.count == 1) goto LAB_001b0da7;
    pVVar7 = CreateConstantPointer
                       (module->allocator,value->source,
                        local_148.data[1]->iValue + (*local_148.data)->iValue,
                        local_148.data[pVVar3 == (VariableData *)0x0]->container,
                        (value->type).structType,true);
    goto LAB_001b0b5c;
  case 0x23:
    VVar1 = (value->type).type;
    uVar10 = (value->type).size;
    if (uVar10 == 4 && VVar1 == VM_TYPE_INT) {
      if ((local_148.count == 1) || (local_148.count == 0)) goto LAB_001b0da7;
      pVVar7 = local_148.data[1];
      iVar9 = (*local_148.data)->iValue;
LAB_001b0479:
      uVar10 = iVar9 - pVVar7->iValue;
      goto LAB_001b0b4c;
    }
    uVar10 = uVar10 ^ 8;
    if (VVar1 == VM_TYPE_DOUBLE && uVar10 == 0) {
      if ((local_148.count == 1) || (local_148.count == 0)) goto LAB_001b0da7;
      value_00 = (*local_148.data)->dValue - local_148.data[1]->dValue;
      goto LAB_001b0ca0;
    }
    if (VVar1 != VM_TYPE_LONG || uVar10 != 0) goto switchD_001afdc1_caseD_8;
    if ((local_148.count == 1) || (local_148.count == 0)) goto LAB_001b0da7;
    pVVar7 = local_148.data[1];
    lVar11 = (*local_148.data)->lValue;
LAB_001b0b19:
    uVar13 = lVar11 - pVVar7->lValue;
    break;
  case 0x24:
    VVar1 = (value->type).type;
    uVar10 = (value->type).size;
    if (uVar10 == 4 && VVar1 == VM_TYPE_INT) {
      if ((local_148.count == 1) || (local_148.count == 0)) goto LAB_001b0da7;
      uVar10 = local_148.data[1]->iValue * (*local_148.data)->iValue;
      goto LAB_001b0b4c;
    }
    uVar10 = uVar10 ^ 8;
    if (VVar1 == VM_TYPE_DOUBLE && uVar10 == 0) {
      if ((local_148.count == 1) || (local_148.count == 0)) goto LAB_001b0da7;
      value_00 = (*local_148.data)->dValue * local_148.data[1]->dValue;
      goto LAB_001b0ca0;
    }
    if (VVar1 != VM_TYPE_LONG || uVar10 != 0) goto switchD_001afdc1_caseD_8;
    if ((local_148.count == 1) || (local_148.count == 0)) goto LAB_001b0da7;
    uVar13 = local_148.data[1]->lValue * (*local_148.data)->lValue;
    break;
  case 0x25:
    if (local_148.count < 2) goto LAB_001b0da7;
    bVar14 = IsConstantZero(&local_148.data[1]->super_VmValue);
    if (bVar14) goto switchD_001afdc1_caseD_8;
    VVar1 = (value->type).type;
    uVar10 = (value->type).size;
    if (uVar10 == 4 && VVar1 == VM_TYPE_INT) {
      if ((local_148.count == 1) || (local_148.count == 0)) goto LAB_001b0da7;
      uVar10 = (*local_148.data)->iValue / local_148.data[1]->iValue;
      goto LAB_001b0b4c;
    }
    uVar10 = uVar10 ^ 8;
    if (VVar1 == VM_TYPE_DOUBLE && uVar10 == 0) {
      if ((local_148.count == 1) || (local_148.count == 0)) goto LAB_001b0da7;
      value_00 = (*local_148.data)->dValue / local_148.data[1]->dValue;
      goto LAB_001b0ca0;
    }
    if (VVar1 != VM_TYPE_LONG || uVar10 != 0) goto switchD_001afdc1_caseD_8;
    if ((local_148.count == 1) || (local_148.count == 0)) goto LAB_001b0da7;
    uVar13 = (*local_148.data)->lValue / local_148.data[1]->lValue;
    break;
  case 0x27:
    if (local_148.count < 2) goto LAB_001b0da7;
    bVar14 = IsConstantZero(&local_148.data[1]->super_VmValue);
    if (bVar14) goto switchD_001afdc1_caseD_8;
    VVar1 = (value->type).type;
    uVar10 = (value->type).size;
    if (uVar10 == 4 && VVar1 == VM_TYPE_INT) {
      if ((local_148.count == 1) || (local_148.count == 0)) goto LAB_001b0da7;
      uVar10 = (*local_148.data)->iValue % local_148.data[1]->iValue;
      goto LAB_001b0b4c;
    }
    if (uVar10 != 8 || VVar1 != VM_TYPE_LONG) goto switchD_001afdc1_caseD_8;
    if ((local_148.count == 1) || (local_148.count == 0)) goto LAB_001b0da7;
    uVar13 = (*local_148.data)->lValue % local_148.data[1]->lValue;
    break;
  case 0x28:
    if (local_148.count == 0) goto LAB_001b0da7;
    pVVar7 = *local_148.data;
    VVar1 = (pVVar7->super_VmValue).type.type;
    uVar10 = (pVVar7->super_VmValue).type.size;
    if (uVar10 == 4 && VVar1 == VM_TYPE_INT) {
      if (local_148.count == 1) goto LAB_001b0da7;
      bVar15 = SBORROW4(pVVar7->iValue,local_148.data[1]->iValue);
      bVar14 = pVVar7->iValue - local_148.data[1]->iValue < 0;
    }
    else {
      uVar10 = uVar10 ^ 8;
      if (VVar1 == VM_TYPE_DOUBLE && uVar10 == 0) {
        if (local_148.count == 1) goto LAB_001b0da7;
        bVar14 = local_148.data[1]->dValue == pVVar7->dValue;
        bVar15 = local_148.data[1]->dValue < pVVar7->dValue;
LAB_001b0987:
        uVar10 = (uint)(!bVar15 && !bVar14);
        goto LAB_001b0b4c;
      }
      if (VVar1 != VM_TYPE_LONG || uVar10 != 0) goto switchD_001afdc1_caseD_8;
      if (local_148.count == 1) goto LAB_001b0da7;
      bVar15 = SBORROW8(pVVar7->lValue,local_148.data[1]->lValue);
      bVar14 = pVVar7->lValue - local_148.data[1]->lValue < 0;
    }
    uVar10 = (uint)(bVar15 != bVar14);
    goto LAB_001b0b4c;
  case 0x29:
    if (local_148.count == 0) goto LAB_001b0da7;
    pVVar7 = *local_148.data;
    VVar1 = (pVVar7->super_VmValue).type.type;
    uVar10 = (pVVar7->super_VmValue).type.size;
    if (uVar10 == 4 && VVar1 == VM_TYPE_INT) {
      if (local_148.count == 1) goto LAB_001b0da7;
      iVar2 = pVVar7->iValue;
      iVar9 = local_148.data[1]->iValue;
      bVar16 = SBORROW4(iVar2,iVar9);
      bVar15 = iVar2 - iVar9 < 0;
      bVar14 = iVar2 == iVar9;
    }
    else {
      uVar10 = uVar10 ^ 8;
      if (VVar1 == VM_TYPE_DOUBLE && uVar10 == 0) {
        if (local_148.count == 1) goto LAB_001b0da7;
        bVar14 = pVVar7->dValue == local_148.data[1]->dValue;
        bVar15 = pVVar7->dValue < local_148.data[1]->dValue;
        goto LAB_001b0987;
      }
      if (VVar1 != VM_TYPE_LONG || uVar10 != 0) goto switchD_001afdc1_caseD_8;
      if (local_148.count == 1) goto LAB_001b0da7;
      lVar11 = pVVar7->lValue;
      lVar4 = local_148.data[1]->lValue;
      bVar16 = SBORROW8(lVar11,lVar4);
      bVar15 = lVar11 - lVar4 < 0;
      bVar14 = lVar11 == lVar4;
    }
    uVar10 = (uint)(!bVar14 && bVar16 == bVar15);
    goto LAB_001b0b4c;
  case 0x2a:
    if (local_148.count == 0) goto LAB_001b0da7;
    pVVar7 = *local_148.data;
    VVar1 = (pVVar7->super_VmValue).type.type;
    uVar10 = (pVVar7->super_VmValue).type.size;
    if (uVar10 == 4 && VVar1 == VM_TYPE_INT) {
      if (local_148.count == 1) goto LAB_001b0da7;
      iVar2 = pVVar7->iValue;
      iVar9 = local_148.data[1]->iValue;
      bVar16 = SBORROW4(iVar2,iVar9);
      bVar15 = iVar2 - iVar9 < 0;
      bVar14 = iVar2 == iVar9;
    }
    else {
      uVar10 = uVar10 ^ 8;
      if (VVar1 == VM_TYPE_DOUBLE && uVar10 == 0) {
        if (local_148.count == 1) goto LAB_001b0da7;
        bVar14 = local_148.data[1]->dValue < pVVar7->dValue;
LAB_001b09f5:
        uVar10 = (uint)!bVar14;
        goto LAB_001b0b4c;
      }
      if (VVar1 != VM_TYPE_LONG || uVar10 != 0) goto switchD_001afdc1_caseD_8;
      if (local_148.count == 1) goto LAB_001b0da7;
      lVar11 = pVVar7->lValue;
      lVar4 = local_148.data[1]->lValue;
      bVar16 = SBORROW8(lVar11,lVar4);
      bVar15 = lVar11 - lVar4 < 0;
      bVar14 = lVar11 == lVar4;
    }
    uVar10 = (uint)(bVar14 || bVar16 != bVar15);
    goto LAB_001b0b4c;
  case 0x2b:
    if (local_148.count == 0) goto LAB_001b0da7;
    pVVar7 = *local_148.data;
    VVar1 = (pVVar7->super_VmValue).type.type;
    uVar10 = (pVVar7->super_VmValue).type.size;
    if (uVar10 == 4 && VVar1 == VM_TYPE_INT) {
      if (local_148.count == 1) goto LAB_001b0da7;
      bVar15 = SBORROW4(pVVar7->iValue,local_148.data[1]->iValue);
      bVar14 = pVVar7->iValue - local_148.data[1]->iValue < 0;
    }
    else {
      uVar10 = uVar10 ^ 8;
      if (VVar1 == VM_TYPE_DOUBLE && uVar10 == 0) {
        if (local_148.count == 1) goto LAB_001b0da7;
        bVar14 = pVVar7->dValue < local_148.data[1]->dValue;
        goto LAB_001b09f5;
      }
      if (VVar1 != VM_TYPE_LONG || uVar10 != 0) goto switchD_001afdc1_caseD_8;
      if (local_148.count == 1) goto LAB_001b0da7;
      bVar15 = SBORROW8(pVVar7->lValue,local_148.data[1]->lValue);
      bVar14 = pVVar7->lValue - local_148.data[1]->lValue < 0;
    }
    uVar10 = (uint)(bVar15 == bVar14);
    goto LAB_001b0b4c;
  case 0x2c:
    if (local_148.count == 0) goto LAB_001b0da7;
    pVVar7 = *local_148.data;
    VVar1 = (pVVar7->super_VmValue).type.type;
    uVar10 = (pVVar7->super_VmValue).type.size;
    if (uVar10 == 4 && VVar1 == VM_TYPE_INT) {
      if (local_148.count == 1) goto LAB_001b0da7;
      bVar14 = pVVar7->iValue == local_148.data[1]->iValue;
    }
    else {
      uVar10 = uVar10 ^ 8;
      if (VVar1 == VM_TYPE_DOUBLE && uVar10 == 0) {
        if (local_148.count == 1) goto LAB_001b0da7;
        bVar14 = local_148.data[1]->dValue == pVVar7->dValue;
LAB_001b0914:
        uVar10 = -(uint)bVar14 & 1;
        goto LAB_001b0b4c;
      }
      if (VVar1 != VM_TYPE_LONG || uVar10 != 0) goto switchD_001afdc1_caseD_8;
      if (local_148.count == 1) goto LAB_001b0da7;
      bVar14 = pVVar7->lValue == local_148.data[1]->lValue;
    }
    goto LAB_001b0b49;
  case 0x2d:
    if (local_148.count == 0) goto LAB_001b0da7;
    pVVar7 = *local_148.data;
    VVar1 = (pVVar7->super_VmValue).type.type;
    uVar10 = (pVVar7->super_VmValue).type.size;
    if (uVar10 == 4 && VVar1 == VM_TYPE_INT) {
      if (local_148.count == 1) goto LAB_001b0da7;
      bVar14 = pVVar7->iValue == local_148.data[1]->iValue;
    }
    else {
      uVar10 = uVar10 ^ 8;
      if (VVar1 == VM_TYPE_DOUBLE && uVar10 == 0) {
        if (local_148.count == 1) goto LAB_001b0da7;
        bVar14 = local_148.data[1]->dValue != pVVar7->dValue;
        goto LAB_001b0914;
      }
      if (VVar1 != VM_TYPE_LONG || uVar10 != 0) goto switchD_001afdc1_caseD_8;
      if (local_148.count == 1) goto LAB_001b0da7;
      bVar14 = pVVar7->lValue == local_148.data[1]->lValue;
    }
    uVar10 = (uint)!bVar14;
    goto LAB_001b0b4c;
  case 0x2e:
    VVar1 = (value->type).type;
    uVar10 = (value->type).size;
    if (uVar10 == 4 && VVar1 == VM_TYPE_INT) {
      if ((local_148.count == 1) || (local_148.count == 0)) goto LAB_001b0da7;
      uVar10 = (*local_148.data)->iValue << ((byte)local_148.data[1]->iValue & 0x1f);
      goto LAB_001b0b4c;
    }
    if (uVar10 != 8 || VVar1 != VM_TYPE_LONG) goto switchD_001afdc1_caseD_8;
    if ((local_148.count == 1) || (local_148.count == 0)) goto LAB_001b0da7;
    uVar13 = (*local_148.data)->lValue << ((byte)local_148.data[1]->lValue & 0x3f);
    break;
  case 0x2f:
    VVar1 = (value->type).type;
    uVar10 = (value->type).size;
    if (uVar10 == 4 && VVar1 == VM_TYPE_INT) {
      if ((local_148.count == 1) || (local_148.count == 0)) goto LAB_001b0da7;
      uVar10 = (*local_148.data)->iValue >> ((byte)local_148.data[1]->iValue & 0x1f);
      goto LAB_001b0b4c;
    }
    if (uVar10 != 8 || VVar1 != VM_TYPE_LONG) goto switchD_001afdc1_caseD_8;
    if ((local_148.count == 1) || (local_148.count == 0)) goto LAB_001b0da7;
    uVar13 = (*local_148.data)->lValue >> ((byte)local_148.data[1]->lValue & 0x3f);
    break;
  case 0x30:
    VVar1 = (value->type).type;
    uVar10 = (value->type).size;
    if (uVar10 == 4 && VVar1 == VM_TYPE_INT) {
      if ((local_148.count == 1) || (local_148.count == 0)) goto LAB_001b0da7;
      uVar10 = local_148.data[1]->iValue & (*local_148.data)->iValue;
      goto LAB_001b0b4c;
    }
    if (uVar10 != 8 || VVar1 != VM_TYPE_LONG) goto switchD_001afdc1_caseD_8;
    if ((local_148.count == 1) || (local_148.count == 0)) goto LAB_001b0da7;
    uVar13 = local_148.data[1]->lValue & (*local_148.data)->lValue;
    break;
  case 0x31:
    VVar1 = (value->type).type;
    uVar10 = (value->type).size;
    if (uVar10 == 4 && VVar1 == VM_TYPE_INT) {
      if ((local_148.count == 1) || (local_148.count == 0)) goto LAB_001b0da7;
      uVar10 = local_148.data[1]->iValue | (*local_148.data)->iValue;
      goto LAB_001b0b4c;
    }
    if (uVar10 != 8 || VVar1 != VM_TYPE_LONG) goto switchD_001afdc1_caseD_8;
    if ((local_148.count == 1) || (local_148.count == 0)) goto LAB_001b0da7;
    uVar13 = local_148.data[1]->lValue | (*local_148.data)->lValue;
    break;
  case 0x32:
    VVar1 = (value->type).type;
    uVar10 = (value->type).size;
    if (uVar10 == 4 && VVar1 == VM_TYPE_INT) {
      if ((local_148.count == 1) || (local_148.count == 0)) goto LAB_001b0da7;
      uVar10 = local_148.data[1]->iValue ^ (*local_148.data)->iValue;
      goto LAB_001b0b4c;
    }
    if (uVar10 != 8 || VVar1 != VM_TYPE_LONG) goto switchD_001afdc1_caseD_8;
    if ((local_148.count == 1) || (local_148.count == 0)) goto LAB_001b0da7;
    uVar13 = local_148.data[1]->lValue ^ (*local_148.data)->lValue;
    break;
  case 0x44:
    VVar1 = (value->type).type;
    uVar10 = (value->type).size;
    if (uVar10 == 4 && VVar1 == VM_TYPE_INT) {
      if (local_148.count == 0) goto LAB_001b0da7;
      pVVar7 = *local_148.data;
      iVar9 = 0;
      goto LAB_001b0479;
    }
    uVar10 = uVar10 ^ 8;
    if (VVar1 != VM_TYPE_DOUBLE || uVar10 != 0) {
      if (VVar1 != VM_TYPE_LONG || uVar10 != 0) goto switchD_001afdc1_caseD_8;
      if (local_148.count == 0) goto LAB_001b0da7;
      pVVar7 = *local_148.data;
      lVar11 = 0;
      goto LAB_001b0b19;
    }
    if (local_148.count == 0) goto LAB_001b0da7;
    value_00 = -(*local_148.data)->dValue;
LAB_001b0ca0:
    pVVar7 = CreateConstantDouble(module->allocator,value->source,value_00);
    goto LAB_001b0b5c;
  case 0x45:
    VVar1 = (value->type).type;
    uVar10 = (value->type).size;
    if (uVar10 == 4 && VVar1 == VM_TYPE_INT) {
      if (local_148.count == 0) goto LAB_001b0da7;
      uVar10 = ~(*local_148.data)->iValue;
      goto LAB_001b0b4c;
    }
    if (uVar10 != 8 || VVar1 != VM_TYPE_LONG) goto switchD_001afdc1_caseD_8;
    if (local_148.count == 0) goto LAB_001b0da7;
    uVar13 = ~(*local_148.data)->lValue;
    break;
  case 0x46:
    if (local_148.count == 0) goto LAB_001b0da7;
    pVVar7 = *local_148.data;
    VVar1 = (pVVar7->super_VmValue).type.type;
    uVar10 = (pVVar7->super_VmValue).type.size;
    if (uVar10 == 4 && VVar1 == VM_TYPE_INT) {
      bVar14 = pVVar7->iValue == 0;
    }
    else {
      if (uVar10 != 8 || VVar1 != VM_TYPE_LONG) goto switchD_001afdc1_caseD_8;
      bVar14 = pVVar7->lValue == 0;
    }
LAB_001b0b49:
    uVar10 = (uint)bVar14;
LAB_001b0b4c:
    pVVar7 = CreateConstantInt(module->allocator,value->source,uVar10);
    goto LAB_001b0b5c;
  }
  pVVar7 = CreateConstantLong(module->allocator,value->source,uVar13);
LAB_001b0b5c:
  anon_unknown.dwarf_13465d::ReplaceValueUsersWith
            (module,value,&pVVar7->super_VmValue,&module->constantPropagations);
switchD_001afdc1_caseD_8:
  SmallArray<VmConstant_*,_32U>::~SmallArray(&local_148);
  return;
}

Assistant:

void RunConstantPropagation(ExpressionContext &ctx, VmModule *module, VmValue* value, bool nested)
{
	if(VmFunction *function = getType<VmFunction>(value))
	{
		VmBlock *curr = function->firstBlock;

		while(curr)
		{
			VmBlock *next = curr->nextSibling;
			RunConstantPropagation(ctx, module, curr, nested);
			curr = next;
		}
	}
	else if(VmBlock *block = getType<VmBlock>(value))
	{
		VmInstruction *curr = block->firstInstruction;

		while(curr)
		{
			VmInstruction *next = curr->nextSibling;
			RunConstantPropagation(ctx, module, curr, nested);
			curr = next;
		}
	}
	else if(VmInstruction *inst = getType<VmInstruction>(value))
	{
		if(inst->type != VmType::Int && inst->type != VmType::Double && inst->type != VmType::Long && inst->type.type != VM_TYPE_POINTER)
			return;

		SmallArray<VmConstant*, 32> consts(module->allocator);

		for(unsigned i = 0; i < inst->arguments.size(); i++)
		{
			VmConstant *constant = getType<VmConstant>(inst->arguments[i]);

			if(!constant)
			{
				if(nested)
				{
					RunConstantPropagation(ctx, module, inst->arguments[i], true);

					constant = getType<VmConstant>(inst->arguments[i]);
				}

				if(!constant)
					return;
			}

			consts.push_back(constant);
		}

		switch(inst->cmd)
		{
		case VM_INST_LOAD_IMMEDIATE:
			if(inst->type == VmType::Int)
				ReplaceValueUsersWith(module, inst, CreateConstantInt(module->allocator, inst->source, consts[0]->iValue), &module->constantPropagations);
			else if(inst->type == VmType::Double)
				ReplaceValueUsersWith(module, inst, CreateConstantDouble(module->allocator, inst->source, consts[0]->dValue), &module->constantPropagations);
			else if(inst->type == VmType::Long)
				ReplaceValueUsersWith(module, inst, CreateConstantLong(module->allocator, inst->source, consts[0]->lValue), &module->constantPropagations);
			break;
		case VM_INST_DOUBLE_TO_INT:
			ReplaceValueUsersWith(module, inst, CreateConstantInt(module->allocator, inst->source, int(consts[0]->dValue)), &module->constantPropagations);
			break;
		case VM_INST_DOUBLE_TO_LONG:
			ReplaceValueUsersWith(module, inst, CreateConstantLong(module->allocator, inst->source, (long long)(consts[0]->dValue)), &module->constantPropagations);
			break;
		case VM_INST_DOUBLE_TO_FLOAT:
		{
			float fValue = float(consts[0]->dValue);

			int iValue;
			assert(sizeof(int) == sizeof(float));
			memcpy(&iValue, &fValue, sizeof(float));

			VmConstant *constant = CreateConstantInt(module->allocator, inst->source, iValue);

			constant->isFloat = true;

			// Replace only call instuction users
			for(unsigned i = 0; i < inst->users.size(); i++)
			{
				if(VmInstruction *userInst = getType<VmInstruction>(inst->users[i]))
				{
					if(userInst->cmd == VM_INST_CALL)
					{
						ReplaceValue(module, inst->users[i], inst, constant);
						module->constantPropagations++;
					}
				}
			}

			module->tempUsers.clear();
		}
			break;
		case VM_INST_INT_TO_DOUBLE:
			ReplaceValueUsersWith(module, inst, CreateConstantDouble(module->allocator, inst->source, double(consts[0]->iValue)), &module->constantPropagations);
			break;
		case VM_INST_LONG_TO_DOUBLE:
			ReplaceValueUsersWith(module, inst, CreateConstantDouble(module->allocator, inst->source, double(consts[0]->lValue)), &module->constantPropagations);
			break;
		case VM_INST_INT_TO_LONG:
			ReplaceValueUsersWith(module, inst, CreateConstantLong(module->allocator, inst->source, (long long)(consts[0]->iValue)), &module->constantPropagations);
			break;
		case VM_INST_LONG_TO_INT:
			ReplaceValueUsersWith(module, inst, CreateConstantInt(module->allocator, inst->source, int(consts[0]->lValue)), &module->constantPropagations);
			break;
		case VM_INST_ADD:
			if(inst->type.type == VM_TYPE_POINTER)
			{
				// Both arguments can't be based on an offset
				assert(!(consts[0]->container && consts[1]->container));

				ReplaceValueUsersWith(module, inst, CreateConstantPointer(module->allocator, inst->source, consts[0]->iValue + consts[1]->iValue, consts[0]->container ? consts[0]->container : consts[1]->container, inst->type.structType, true), &module->constantPropagations);
			}
			else
			{
				if(inst->type == VmType::Int)
					ReplaceValueUsersWith(module, inst, CreateConstantInt(module->allocator, inst->source, consts[0]->iValue + consts[1]->iValue), &module->constantPropagations);
				else if(inst->type == VmType::Double)
					ReplaceValueUsersWith(module, inst, CreateConstantDouble(module->allocator, inst->source, consts[0]->dValue + consts[1]->dValue), &module->constantPropagations);
				else if(inst->type == VmType::Long)
					ReplaceValueUsersWith(module, inst, CreateConstantLong(module->allocator, inst->source, consts[0]->lValue + consts[1]->lValue), &module->constantPropagations);
			}
			break;
		case VM_INST_SUB:
			if(inst->type == VmType::Int)
				ReplaceValueUsersWith(module, inst, CreateConstantInt(module->allocator, inst->source, consts[0]->iValue - consts[1]->iValue), &module->constantPropagations);
			else if(inst->type == VmType::Double)
				ReplaceValueUsersWith(module, inst, CreateConstantDouble(module->allocator, inst->source, consts[0]->dValue - consts[1]->dValue), &module->constantPropagations);
			else if(inst->type == VmType::Long)
				ReplaceValueUsersWith(module, inst, CreateConstantLong(module->allocator, inst->source, consts[0]->lValue - consts[1]->lValue), &module->constantPropagations);
			break;
		case VM_INST_MUL:
			if(inst->type == VmType::Int)
				ReplaceValueUsersWith(module, inst, CreateConstantInt(module->allocator, inst->source, consts[0]->iValue * consts[1]->iValue), &module->constantPropagations);
			else if(inst->type == VmType::Double)
				ReplaceValueUsersWith(module, inst, CreateConstantDouble(module->allocator, inst->source, consts[0]->dValue * consts[1]->dValue), &module->constantPropagations);
			else if(inst->type == VmType::Long)
				ReplaceValueUsersWith(module, inst, CreateConstantLong(module->allocator, inst->source, consts[0]->lValue * consts[1]->lValue), &module->constantPropagations);
			break;
		case VM_INST_DIV:
			if(!IsConstantZero(consts[1]))
			{
				if(inst->type == VmType::Int)
					ReplaceValueUsersWith(module, inst, CreateConstantInt(module->allocator, inst->source, consts[0]->iValue / consts[1]->iValue), &module->constantPropagations);
				else if(inst->type == VmType::Double)
					ReplaceValueUsersWith(module, inst, CreateConstantDouble(module->allocator, inst->source, consts[0]->dValue / consts[1]->dValue), &module->constantPropagations);
				else if(inst->type == VmType::Long)
					ReplaceValueUsersWith(module, inst, CreateConstantLong(module->allocator, inst->source, consts[0]->lValue / consts[1]->lValue), &module->constantPropagations);
			}
			break;
		case VM_INST_MOD:
			if(!IsConstantZero(consts[1]))
			{
				if(inst->type == VmType::Int)
					ReplaceValueUsersWith(module, inst, CreateConstantInt(module->allocator, inst->source, consts[0]->iValue % consts[1]->iValue), &module->constantPropagations);
				else if(inst->type == VmType::Long)
					ReplaceValueUsersWith(module, inst, CreateConstantLong(module->allocator, inst->source, consts[0]->lValue % consts[1]->lValue), &module->constantPropagations);
			}
			break;
		case VM_INST_LESS:
			if(consts[0]->type == VmType::Int)
				ReplaceValueUsersWith(module, inst, CreateConstantInt(module->allocator, inst->source, consts[0]->iValue < consts[1]->iValue), &module->constantPropagations);
			else if(consts[0]->type == VmType::Double)
				ReplaceValueUsersWith(module, inst, CreateConstantInt(module->allocator, inst->source, consts[0]->dValue < consts[1]->dValue), &module->constantPropagations);
			else if(consts[0]->type == VmType::Long)
				ReplaceValueUsersWith(module, inst, CreateConstantInt(module->allocator, inst->source, consts[0]->lValue < consts[1]->lValue), &module->constantPropagations);
			break;
		case VM_INST_GREATER:
			if(consts[0]->type == VmType::Int)
				ReplaceValueUsersWith(module, inst, CreateConstantInt(module->allocator, inst->source, consts[0]->iValue > consts[1]->iValue), &module->constantPropagations);
			else if(consts[0]->type == VmType::Double)
				ReplaceValueUsersWith(module, inst, CreateConstantInt(module->allocator, inst->source, consts[0]->dValue > consts[1]->dValue), &module->constantPropagations);
			else if(consts[0]->type == VmType::Long)
				ReplaceValueUsersWith(module, inst, CreateConstantInt(module->allocator, inst->source, consts[0]->lValue > consts[1]->lValue), &module->constantPropagations);
			break;
		case VM_INST_LESS_EQUAL:
			if(consts[0]->type == VmType::Int)
				ReplaceValueUsersWith(module, inst, CreateConstantInt(module->allocator, inst->source, consts[0]->iValue <= consts[1]->iValue), &module->constantPropagations);
			else if(consts[0]->type == VmType::Double)
				ReplaceValueUsersWith(module, inst, CreateConstantInt(module->allocator, inst->source, consts[0]->dValue <= consts[1]->dValue), &module->constantPropagations);
			else if(consts[0]->type == VmType::Long)
				ReplaceValueUsersWith(module, inst, CreateConstantInt(module->allocator, inst->source, consts[0]->lValue <= consts[1]->lValue), &module->constantPropagations);
			break;
		case VM_INST_GREATER_EQUAL:
			if(consts[0]->type == VmType::Int)
				ReplaceValueUsersWith(module, inst, CreateConstantInt(module->allocator, inst->source, consts[0]->iValue >= consts[1]->iValue), &module->constantPropagations);
			else if(consts[0]->type == VmType::Double)
				ReplaceValueUsersWith(module, inst, CreateConstantInt(module->allocator, inst->source, consts[0]->dValue >= consts[1]->dValue), &module->constantPropagations);
			else if(consts[0]->type == VmType::Long)
				ReplaceValueUsersWith(module, inst, CreateConstantInt(module->allocator, inst->source, consts[0]->lValue >= consts[1]->lValue), &module->constantPropagations);
			break;
		case VM_INST_EQUAL:
			if(consts[0]->type == VmType::Int)
				ReplaceValueUsersWith(module, inst, CreateConstantInt(module->allocator, inst->source, consts[0]->iValue == consts[1]->iValue), &module->constantPropagations);
			else if(consts[0]->type == VmType::Double)
				ReplaceValueUsersWith(module, inst, CreateConstantInt(module->allocator, inst->source, consts[0]->dValue == consts[1]->dValue), &module->constantPropagations);
			else if(consts[0]->type == VmType::Long)
				ReplaceValueUsersWith(module, inst, CreateConstantInt(module->allocator, inst->source, consts[0]->lValue == consts[1]->lValue), &module->constantPropagations);
			break;
		case VM_INST_NOT_EQUAL:
			if(consts[0]->type == VmType::Int)
				ReplaceValueUsersWith(module, inst, CreateConstantInt(module->allocator, inst->source, consts[0]->iValue != consts[1]->iValue), &module->constantPropagations);
			else if(consts[0]->type == VmType::Double)
				ReplaceValueUsersWith(module, inst, CreateConstantInt(module->allocator, inst->source, consts[0]->dValue != consts[1]->dValue), &module->constantPropagations);
			else if(consts[0]->type == VmType::Long)
				ReplaceValueUsersWith(module, inst, CreateConstantInt(module->allocator, inst->source, consts[0]->lValue != consts[1]->lValue), &module->constantPropagations);
			break;
		case VM_INST_SHL:
			if(inst->type == VmType::Int)
				ReplaceValueUsersWith(module, inst, CreateConstantInt(module->allocator, inst->source, consts[0]->iValue << consts[1]->iValue), &module->constantPropagations);
			else if(inst->type == VmType::Long)
				ReplaceValueUsersWith(module, inst, CreateConstantLong(module->allocator, inst->source, consts[0]->lValue << consts[1]->lValue), &module->constantPropagations);
			break;
		case VM_INST_SHR:
			if(inst->type == VmType::Int)
				ReplaceValueUsersWith(module, inst, CreateConstantInt(module->allocator, inst->source, consts[0]->iValue >> consts[1]->iValue), &module->constantPropagations);
			else if(inst->type == VmType::Long)
				ReplaceValueUsersWith(module, inst, CreateConstantLong(module->allocator, inst->source, consts[0]->lValue >> consts[1]->lValue), &module->constantPropagations);
			break;
		case VM_INST_BIT_AND:
			if(inst->type == VmType::Int)
				ReplaceValueUsersWith(module, inst, CreateConstantInt(module->allocator, inst->source, consts[0]->iValue & consts[1]->iValue), &module->constantPropagations);
			else if(inst->type == VmType::Long)
				ReplaceValueUsersWith(module, inst, CreateConstantLong(module->allocator, inst->source, consts[0]->lValue & consts[1]->lValue), &module->constantPropagations);
			break;
		case VM_INST_BIT_OR:
			if(inst->type == VmType::Int)
				ReplaceValueUsersWith(module, inst, CreateConstantInt(module->allocator, inst->source, consts[0]->iValue | consts[1]->iValue), &module->constantPropagations);
			else if(inst->type == VmType::Long)
				ReplaceValueUsersWith(module, inst, CreateConstantLong(module->allocator, inst->source, consts[0]->lValue | consts[1]->lValue), &module->constantPropagations);
			break;
		case VM_INST_BIT_XOR:
			if(inst->type == VmType::Int)
				ReplaceValueUsersWith(module, inst, CreateConstantInt(module->allocator, inst->source, consts[0]->iValue ^ consts[1]->iValue), &module->constantPropagations);
			else if(inst->type == VmType::Long)
				ReplaceValueUsersWith(module, inst, CreateConstantLong(module->allocator, inst->source, consts[0]->lValue ^ consts[1]->lValue), &module->constantPropagations);
			break;
		case VM_INST_NEG:
			if(inst->type == VmType::Int)
				ReplaceValueUsersWith(module, inst, CreateConstantInt(module->allocator, inst->source, -consts[0]->iValue), &module->constantPropagations);
			else if(inst->type == VmType::Double)
				ReplaceValueUsersWith(module, inst, CreateConstantDouble(module->allocator, inst->source, -consts[0]->dValue), &module->constantPropagations);
			else if(inst->type == VmType::Long)
				ReplaceValueUsersWith(module, inst, CreateConstantLong(module->allocator, inst->source, -consts[0]->lValue), &module->constantPropagations);
			break;
		case VM_INST_BIT_NOT:
			if(inst->type == VmType::Int)
				ReplaceValueUsersWith(module, inst, CreateConstantInt(module->allocator, inst->source, ~consts[0]->iValue), &module->constantPropagations);
			else if(inst->type == VmType::Long)
				ReplaceValueUsersWith(module, inst, CreateConstantLong(module->allocator, inst->source, ~consts[0]->lValue), &module->constantPropagations);
			break;
		case VM_INST_LOG_NOT:
			if(consts[0]->type == VmType::Int)
				ReplaceValueUsersWith(module, inst, CreateConstantInt(module->allocator, inst->source, !consts[0]->iValue), &module->constantPropagations);
			else if(consts[0]->type == VmType::Long)
				ReplaceValueUsersWith(module, inst, CreateConstantInt(module->allocator, inst->source, !consts[0]->lValue), &module->constantPropagations);
			break;
		case VM_INST_INDEX:
			{
				unsigned arrayLength = consts[0]->iValue;
				unsigned elementSize = consts[1]->iValue;

				unsigned ptr = consts[2]->iValue;
				unsigned index = consts[3]->iValue;

				if(index < arrayLength)
					ReplaceValueUsersWith(module, inst, CreateConstantPointer(module->allocator, inst->source, ptr + elementSize * index, consts[2]->container, inst->type.structType, true), &module->constantPropagations);
			}
			break;
		default:
			break;
		}
	}
}